

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpcaf_grammar_and(int n,mpc_val_t **xs)

{
  mpc_parser_t *pmVar1;
  ulong uVar2;
  
  pmVar1 = (mpc_parser_t *)calloc(1,0x38);
  pmVar1->type = '\x01';
  if (0 < n) {
    uVar2 = 0;
    do {
      if (xs[uVar2] != (mpc_val_t *)0x0) {
        pmVar1 = mpca_and(2,pmVar1);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return pmVar1;
}

Assistant:

static mpc_val_t *mpcaf_grammar_and(int n, mpc_val_t **xs) {
  int i;
  mpc_parser_t *p = mpc_pass();
  for (i = 0; i < n; i++) {
    if (xs[i] != NULL) { p = mpca_and(2, p, xs[i]); }
  }
  return p;
}